

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkDescriptorType * __thiscall
Fossilize::StateRecorder::Impl::copy<VkDescriptorType>
          (Impl *this,VkDescriptorType *src,size_t count,ScratchAllocator *alloc)

{
  VkDescriptorType *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkDescriptorType>(alloc,count);
    if (pVVar1 != (VkDescriptorType *)0x0) {
      pVVar1 = (VkDescriptorType *)memmove(pVVar1,src,count << 2);
      return pVVar1;
    }
  }
  return (VkDescriptorType *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}